

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O3

bool __thiscall
QHttpNetworkConnectionPrivate::shouldEmitChannelError
          (QHttpNetworkConnectionPrivate *this,QIODevice *socket)

{
  QObject *pQVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  NetworkLayerPreferenceState NVar5;
  QHttpNetworkConnectionChannel *pQVar6;
  int __fd;
  long in_FS_OFFSET;
  bool bVar7;
  void *local_48;
  char *pcStack_40;
  QMetaTypeInterface *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  iVar4 = indexOf(this,socket);
  __fd = (int)socket;
  cVar2 = QTimer::isActive();
  if (cVar2 != '\0') {
    QTimer::stop();
    QHttpNetworkConnectionChannel::ensureConnection
              ((QHttpNetworkConnectionChannel *)
               (&this->channels->super_QObject +
               ((uint)(iVar4 == 0) * 0x100 + (uint)(iVar4 == 0) * 8)));
  }
  NVar5 = this->networkLayerState;
  if (this->activeChannelCount < this->channelCount) {
    if ((NVar5 == IPv4or6) || (NVar5 == HostLookupPending)) {
      this->networkLayerState = Unknown;
    }
    pQVar6 = this->channels;
LAB_001fe3b5:
    QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)pQVar6,__fd);
LAB_001fe3ba:
    bVar3 = true;
  }
  else {
    switch(NVar5) {
    case HostLookupPending:
    case IPv4or6:
      bVar7 = iVar4 == 0;
      bVar3 = QHttpNetworkConnectionChannel::isSocketBusy
                        ((QHttpNetworkConnectionChannel *)
                         (&this->channels->super_QObject + ((uint)bVar7 * 0x100 + (uint)bVar7 * 8)))
      ;
      pQVar6 = this->channels;
      if ((bVar3) &&
         (*(int *)((long)&pQVar6->state + (ulong)((uint)bVar7 * 0x100 + (uint)bVar7 * 8)) != 0x10))
      {
        QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)(pQVar6 + iVar4),__fd)
        ;
        bVar3 = false;
        goto LAB_001fe460;
      }
      this->networkLayerState = Unknown;
      pQVar6 = pQVar6 + iVar4;
      goto LAB_001fe3b5;
    case IPv4:
      pQVar6 = this->channels;
      if (pQVar6[iVar4].networkLayerPreference != IPv4Protocol) goto LAB_001fe405;
      goto LAB_001fe3ba;
    case IPv6:
      pQVar6 = this->channels;
      bVar3 = true;
      if (pQVar6[iVar4].networkLayerPreference == IPv6Protocol) goto LAB_001fe460;
LAB_001fe405:
      QHttpNetworkConnectionChannel::close((QHttpNetworkConnectionChannel *)(pQVar6 + iVar4),__fd);
      local_48 = (void *)0x0;
      pcStack_40 = (char *)0x0;
      local_38 = (QMetaTypeInterface *)0x0;
      QMetaObject::invokeMethodImpl
                (pQVar1,"_q_startNextRequest",QueuedConnection,1,&local_48,&pcStack_40,&local_38);
      NVar5 = this->networkLayerState;
      bVar3 = false;
      break;
    default:
      bVar3 = true;
    }
    if (NVar5 == Unknown) {
      shouldEmitChannelError();
    }
  }
LAB_001fe460:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QHttpNetworkConnectionPrivate::shouldEmitChannelError(QIODevice *socket)
{
    Q_Q(QHttpNetworkConnection);

    bool emitError = true;
    int i = indexOf(socket);
    int otherSocket = (i == 0 ? 1 : 0);

    // If the IPv4 connection still isn't started we need to start it now.
    if (delayedConnectionTimer.isActive()) {
        delayedConnectionTimer.stop();
        channels[otherSocket].ensureConnection();
    }

    if (activeChannelCount < channelCount) {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6)
            networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
        channels[0].close();
        emitError = true;
    } else {
        if (networkLayerState == HostLookupPending || networkLayerState == IPv4or6) {
            if (channels[otherSocket].isSocketBusy() && (channels[otherSocket].state != QHttpNetworkConnectionChannel::ClosingState)) {
                // this was the first socket to fail.
                channels[i].close();
                emitError = false;
            }
            else {
                // Both connection attempts has failed.
                networkLayerState = QHttpNetworkConnectionPrivate::Unknown;
                channels[i].close();
                emitError = true;
            }
        } else {
            if (((networkLayerState == QHttpNetworkConnectionPrivate::IPv4) && (channels[i].networkLayerPreference != QAbstractSocket::IPv4Protocol))
                || ((networkLayerState == QHttpNetworkConnectionPrivate::IPv6) && (channels[i].networkLayerPreference != QAbstractSocket::IPv6Protocol))) {
                // First connection worked so this is the second one to complete and it failed.
                channels[i].close();
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                emitError = false;
            }
            if (networkLayerState == QHttpNetworkConnectionPrivate::Unknown)
                qWarning("We got a connection error when networkLayerState is Unknown");
        }
    }
    return emitError;
}